

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetSourceFilesPropertiesCommand.h
# Opt level: O1

void __thiscall
cmSetSourceFilesPropertiesCommand::~cmSetSourceFilesPropertiesCommand
          (cmSetSourceFilesPropertiesCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_0062cb40;
  pcVar2 = (this->super_cmCommand).Error._M_dataplus._M_p;
  paVar1 = &(this->super_cmCommand).Error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmSetSourceFilesPropertiesCommand; }